

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O2

void __thiscall MiniScript::Context::StoreValue(Context *this,Value *lhs,Value *value)

{
  int tempNum;
  RefCountedStorage *pRVar1;
  String *pSVar2;
  Value *pVVar3;
  Value index;
  Value seq;
  undefined1 local_f8 [48];
  Value local_c8;
  Value local_b8;
  Value local_a8;
  String local_98;
  String local_88;
  Value local_78;
  Value local_68;
  Value local_58;
  Value local_48;
  Value local_38;
  
  switch(lhs->type) {
  case Null:
    goto switchD_0013bf76_caseD_0;
  default:
    pVVar3 = &local_58;
    String::String((String *)pVVar3,"not an lvalue");
    RuntimeException::RuntimeException((RuntimeException *)local_f8,(String *)pVVar3);
    RuntimeException::raise((RuntimeException *)local_f8,(int)pVVar3);
    MiniscriptException::~MiniscriptException((MiniscriptException *)local_f8);
    pVVar3 = &local_58;
    break;
  case Temp:
    tempNum = (lhs->data).tempNum;
    Value::Value(&local_48,value);
    SetTemp(this,tempNum,&local_48);
    pVVar3 = &local_48;
    goto LAB_0013c158;
  case Var:
    Value::GetString(&local_68);
    Value::Value(&local_78,value);
    SetVar(this,(String *)&local_68,&local_78);
    Value::~Value(&local_78);
    pVVar3 = &local_68;
    break;
  case SeqElem:
    pRVar1 = (lhs->data).ref;
    Value::Val(&local_b8,(Context *)(pRVar1 + 1),(ValueDict *)this);
    if ((bool)local_b8.type == false) {
      String::String(&local_88,"can\'t set indexed element of null");
      pSVar2 = &local_88;
      RuntimeException::RuntimeException((RuntimeException *)local_f8,pSVar2);
      RuntimeException::raise((RuntimeException *)local_f8,(int)pSVar2);
      MiniscriptException::~MiniscriptException((MiniscriptException *)local_f8);
      String::~String(&local_88);
    }
    if ((local_b8.type & 0xfe) != 4) {
      String::String(&local_98,"can\'t set an indexed element in this type");
      pSVar2 = &local_98;
      RuntimeException::RuntimeException((RuntimeException *)local_f8,pSVar2);
      RuntimeException::raise((RuntimeException *)local_f8,(int)pSVar2);
      MiniscriptException::~MiniscriptException((MiniscriptException *)local_f8);
      String::~String(&local_98);
    }
    Value::Value((Value *)local_f8,(Value *)(pRVar1 + 2));
    if (((byte)local_f8[0] < 9) && ((0x184U >> ((byte)local_f8[0] & 0x1f) & 1) != 0)) {
      Value::Val(&local_38,(Context *)local_f8,(ValueDict *)this);
      Value::operator=((Value *)local_f8,&local_38);
      Value::~Value(&local_38);
    }
    local_c8.noInvoke = (bool)local_f8[1];
    local_c8.localOnly = local_f8[2];
    local_c8.data.ref = (RefCountedStorage *)local_f8._8_8_;
    if ((StringStorage *)local_f8._8_8_ != (StringStorage *)0x0 && 2 < (byte)local_f8[0]) {
      *(long *)(local_f8._8_8_ + 8) = *(long *)(local_f8._8_8_ + 8) + 1;
    }
    Value::Value(&local_a8,value);
    Value::SetElem(&local_b8,&local_c8,&local_a8);
    Value::~Value(&local_a8);
    Value::~Value(&local_c8);
    Value::~Value((Value *)local_f8);
    pVVar3 = &local_b8;
LAB_0013c158:
    Value::~Value(pVVar3);
    goto switchD_0013bf76_caseD_0;
  }
  String::~String((String *)pVVar3);
switchD_0013bf76_caseD_0:
  return;
}

Assistant:

void Context::StoreValue(Value lhs, Value value) {
//		std::cout << "Storing into " << lhs.ToString().c_str() << ": " << value.ToString().c_str() << std::endl;
		if (lhs.type == ValueType::Temp) {
			SetTemp(lhs.data.tempNum, value);
		} else if (lhs.type == ValueType::Var) {
			SetVar(lhs.GetString(), value);
		} else if (lhs.type == ValueType::SeqElem) {
			SeqElemStorage *seqElem = (SeqElemStorage*)(lhs.data.ref);
			Value seq = seqElem->sequence.Val(this);
			if (seq.IsNull()) RuntimeException("can't set indexed element of null").raise();
			if (not seq.CanSetElem()) RuntimeException("can't set an indexed element in this type").raise();
			Value index = seqElem->index;
			if (index.type == ValueType::Var or index.type == ValueType::SeqElem or
				index.type == ValueType::Temp) index = index.Val(this);
			seq.SetElem(index, value);
		} else {
			if (!lhs.IsNull()) RuntimeException("not an lvalue").raise();
		}
	}